

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O3

int envy_bios_parse_spreadspectrum(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  envy_bios_spreadspectrum_entry *peVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  char *__format;
  int iVar15;
  
  uVar3 = (bios->spreadspectrum).offset;
  if (uVar3 == 0) {
    return 0;
  }
  uVar8 = bios->length;
  if (uVar3 < uVar8) {
    (bios->spreadspectrum).version = bios->data[(uint)uVar3];
    iVar15 = 0;
  }
  else {
    (bios->spreadspectrum).version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    uVar3 = (bios->spreadspectrum).offset;
    uVar8 = bios->length;
    iVar15 = -0xe;
  }
  uVar11 = (ulong)uVar3;
  lVar9 = uVar11 + 1;
  if ((uint)lVar9 < uVar8) {
    (bios->spreadspectrum).hlen = bios->data[lVar9];
    iVar14 = 0;
  }
  else {
    (bios->spreadspectrum).hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
    uVar11 = (ulong)(bios->spreadspectrum).offset;
    uVar8 = bios->length;
    iVar14 = -0xe;
  }
  uVar6 = (uint)uVar11;
  lVar9 = uVar11 + 2;
  if ((uint)lVar9 < uVar8) {
    (bios->spreadspectrum).entriesnum = bios->data[lVar9];
    iVar4 = 0;
  }
  else {
    (bios->spreadspectrum).entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
    uVar6 = (uint)(bios->spreadspectrum).offset;
    uVar8 = bios->length;
    iVar4 = -0xe;
  }
  if ((uint)((ulong)uVar6 + 3) < uVar8) {
    (bios->spreadspectrum).rlen = bios->data[(ulong)uVar6 + 3];
    iVar5 = 0;
  }
  else {
    (bios->spreadspectrum).rlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar5 = -0xe;
  }
  if (((iVar14 == 0 && iVar15 == 0) && iVar4 == 0) && iVar5 == 0) {
    envy_bios_block(bios,(uint)(bios->spreadspectrum).offset,
                    (uint)(bios->spreadspectrum).entriesnum * (uint)(bios->spreadspectrum).rlen +
                    (uint)(bios->spreadspectrum).hlen,"SPREADSPECTRUM",-1);
    uVar1 = (bios->spreadspectrum).version;
    if (uVar1 == '1') {
LAB_00257d99:
      uVar11 = (ulong)(bios->spreadspectrum).offset;
      uVar8 = bios->length;
      if ((uint)(uVar11 + 4) < uVar8) {
        (bios->spreadspectrum).unk04 = bios->data[uVar11 + 4];
        iVar15 = 0;
      }
      else {
        (bios->spreadspectrum).unk04 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar11 = (ulong)(bios->spreadspectrum).offset;
        uVar8 = bios->length;
        iVar15 = -0xe;
      }
      if ((uint)(uVar11 + 5) < uVar8) {
        (bios->spreadspectrum).unk05 = bios->data[uVar11 + 5];
        iVar14 = 0;
      }
      else {
        (bios->spreadspectrum).unk05 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar11 = (ulong)(bios->spreadspectrum).offset;
        uVar8 = bios->length;
        iVar14 = -0xe;
      }
      if ((uint)(uVar11 + 6) < uVar8) {
        (bios->spreadspectrum).unk06 = bios->data[uVar11 + 6];
        iVar4 = 0;
      }
      else {
        (bios->spreadspectrum).unk06 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar11 = (ulong)(bios->spreadspectrum).offset;
        uVar8 = bios->length;
        iVar4 = -0xe;
      }
      if ((uint)(uVar11 + 7) < uVar8) {
        (bios->spreadspectrum).unk07 = bios->data[uVar11 + 7];
        iVar5 = 0;
      }
      else {
        (bios->spreadspectrum).unk07 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar11 = (ulong)(bios->spreadspectrum).offset;
        uVar8 = bios->length;
        iVar5 = -0xe;
      }
      uVar6 = (uint)uVar11;
      if ((uint)(uVar11 + 8) < uVar8) {
        (bios->spreadspectrum).unk08 = bios->data[uVar11 + 8];
        iVar12 = 0;
      }
      else {
        (bios->spreadspectrum).unk08 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar6 = (uint)(bios->spreadspectrum).offset;
        uVar8 = bios->length;
        iVar12 = -0xe;
      }
      if ((uint)((ulong)uVar6 + 9) < uVar8) {
        (bios->spreadspectrum).unk09 = bios->data[(ulong)uVar6 + 9];
        iVar7 = 0;
      }
      else {
        (bios->spreadspectrum).unk09 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      if (((((iVar14 != 0 || iVar15 != 0) || iVar4 != 0) || iVar5 != 0) || iVar12 != 0) ||
          iVar7 != 0) goto LAB_00257d2a;
      uVar8 = 1;
      uVar11 = 10;
LAB_00257ea7:
      bVar2 = (bios->spreadspectrum).hlen;
      uVar6 = (uint)bVar2;
      if ((uint)bVar2 < (uint)uVar11) {
        __format = "SPREADSPECTRUM table header too short [%d < %d]\n";
        uVar13 = (ulong)uVar6;
      }
      else {
        bVar2 = (bios->spreadspectrum).rlen;
        uVar13 = (ulong)bVar2;
        if (uVar8 <= bVar2) {
          if ((uint)uVar11 < uVar6) {
            fprintf(_stderr,"SPREADSPECTRUM table header longer than expected [%d > %d]\n",
                    (ulong)uVar6);
            uVar13 = (ulong)(bios->spreadspectrum).rlen;
          }
          if (uVar8 < (uint)uVar13) {
            fprintf(_stderr,"SPREADSPECTRUM table record longer than expected [%d > %d]\n",uVar13,
                    (ulong)uVar8);
          }
          bVar2 = (bios->spreadspectrum).entriesnum;
          peVar10 = (envy_bios_spreadspectrum_entry *)calloc((ulong)bVar2,4);
          (bios->spreadspectrum).entries = peVar10;
          if (peVar10 == (envy_bios_spreadspectrum_entry *)0x0) {
            return -0xc;
          }
          if (bVar2 != 0) {
            uVar11 = 0;
            do {
              peVar10 = (bios->spreadspectrum).entries;
              uVar8 = (uint)(bios->spreadspectrum).rlen * (int)uVar11 +
                      (uint)(bios->spreadspectrum).hlen + (uint)(bios->spreadspectrum).offset;
              peVar10[uVar11].offset = (uint16_t)uVar8;
              uVar8 = uVar8 & 0xffff;
              if (uVar8 < bios->length) {
                peVar10[uVar11].unk00 = bios->data[uVar8];
                uVar8 = 0;
              }
              else {
                peVar10[uVar11].unk00 = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar8 = 0xfffffff2;
              }
              if (1 < (bios->spreadspectrum).rlen) {
                lVar9 = (ulong)peVar10[uVar11].offset + 1;
                if ((uint)lVar9 < bios->length) {
                  peVar10[uVar11].unk01 = bios->data[lVar9];
                  uVar6 = 0;
                }
                else {
                  peVar10[uVar11].unk01 = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar6 = 0xfffffff2;
                }
                uVar8 = uVar8 | uVar6;
              }
              if (uVar8 != 0) goto LAB_00257d2a;
              uVar11 = uVar11 + 1;
            } while (uVar11 < (bios->spreadspectrum).entriesnum);
          }
          (bios->spreadspectrum).valid = '\x01';
          return 0;
        }
        __format = "SPREADSPECTRUM table record too short [%d < %d]\n";
        uVar11 = (ulong)uVar8;
      }
      fprintf(_stderr,__format,uVar13,uVar11);
    }
    else {
      if (uVar1 == 'A') {
        lVar9 = (ulong)(bios->spreadspectrum).offset + 4;
        if (bios->length <= (uint)lVar9) {
          (bios->spreadspectrum).unk04 = '\0';
          fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          goto LAB_00257d2a;
        }
        uVar8 = 2 - ((bios->spreadspectrum).rlen < 2);
        (bios->spreadspectrum).unk04 = bios->data[lVar9];
        uVar11 = 5;
        goto LAB_00257ea7;
      }
      if (uVar1 == '@') goto LAB_00257d99;
      envy_bios_parse_spreadspectrum_cold_1();
    }
    iVar15 = -0x16;
  }
  else {
LAB_00257d2a:
    iVar15 = -0xe;
  }
  return iVar15;
}

Assistant:

int envy_bios_parse_spreadspectrum (struct envy_bios *bios) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, spreadspectrum->offset, &spreadspectrum->version);
	err |= bios_u8(bios, spreadspectrum->offset+1, &spreadspectrum->hlen);
	err |= bios_u8(bios, spreadspectrum->offset+2, &spreadspectrum->entriesnum);
	err |= bios_u8(bios, spreadspectrum->offset+3, &spreadspectrum->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, spreadspectrum->offset, spreadspectrum->hlen + spreadspectrum->rlen * spreadspectrum->entriesnum, "SPREADSPECTRUM", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (spreadspectrum->version) {
		case 0x31:
		case 0x40:
			wanthlen = 10;
			wantrlen = 1;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			err |= bios_u8(bios, spreadspectrum->offset+5, &spreadspectrum->unk05);
			err |= bios_u8(bios, spreadspectrum->offset+6, &spreadspectrum->unk06);
			err |= bios_u8(bios, spreadspectrum->offset+7, &spreadspectrum->unk07);
			err |= bios_u8(bios, spreadspectrum->offset+8, &spreadspectrum->unk08);
			err |= bios_u8(bios, spreadspectrum->offset+9, &spreadspectrum->unk09);
			if (err)
				return -EFAULT;
			break;
		case 0x41:
			wanthlen = 5;
			wantrlen = 1;
			if (spreadspectrum->rlen >= 2)
				wantrlen = 2;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			if (err)
				return -EFAULT;
			break;
		default:
			ENVY_BIOS_ERR("Unknown SPREADSPECTRUM table version %d.%d\n", spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
			return -EINVAL;
	}
	if (spreadspectrum->hlen < wanthlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table header too short [%d < %d]\n", spreadspectrum->hlen, wanthlen);
		return -EINVAL;
	}
	if (spreadspectrum->rlen < wantrlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table record too short [%d < %d]\n", spreadspectrum->rlen, wantrlen);
		return -EINVAL;
	}
	if (spreadspectrum->hlen > wanthlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table header longer than expected [%d > %d]\n", spreadspectrum->hlen, wanthlen);
	}
	if (spreadspectrum->rlen > wantrlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table record longer than expected [%d > %d]\n", spreadspectrum->rlen, wantrlen);
	}
	spreadspectrum->entries = calloc(spreadspectrum->entriesnum, sizeof *spreadspectrum->entries);
	if (!spreadspectrum->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		entry->offset = spreadspectrum->offset + spreadspectrum->hlen + spreadspectrum->rlen * i;
		err |= bios_u8(bios, entry->offset+0, &entry->unk00);
		if (spreadspectrum->rlen >= 2)
			err |= bios_u8(bios, entry->offset+1, &entry->unk01);
		if (err)
			return -EFAULT;
	}
	spreadspectrum->valid = 1;
	return 0;
}